

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_oct.c
# Opt level: O3

REF_STATUS ref_oct_split(REF_OCT ref_oct,REF_INT node)

{
  REF_INT *pRVar1;
  int iVar2;
  REF_INT *pRVar3;
  int iVar4;
  long lVar5;
  undefined8 uVar6;
  ulong uVar7;
  char *pcVar8;
  
  if (node < 0) {
    pcVar8 = "node negative";
    uVar6 = 0xa2;
  }
  else if (node < ref_oct->n) {
    iVar4 = ref_oct->max;
    if (node < iVar4) {
      lVar5 = 0;
      do {
        if ((long)ref_oct->children[(ulong)(uint)(node << 3) + lVar5] != -1) {
          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_oct.c",
                 0xa6,"ref_oct_split","child not empty",0xffffffffffffffff,
                 (long)ref_oct->children[(ulong)(uint)(node << 3) + lVar5]);
          return 1;
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 != 8);
      if (ref_oct->n + 8 <= iVar4) {
LAB_00175df1:
        iVar4 = ref_oct->n;
        pRVar3 = ref_oct->children;
        lVar5 = 0;
        do {
          pRVar3[(ulong)(uint)(node << 3) + lVar5] = iVar4;
          iVar4 = ref_oct->n + 1;
          ref_oct->n = iVar4;
          lVar5 = lVar5 + 1;
        } while (lVar5 != 8);
        return 0;
      }
      if (iVar4 < 0x4bda12f) {
        iVar2 = 0x4bda12f - iVar4;
        if ((int)((double)iVar4 * 1.5) <= 0x4bda12f - iVar4) {
          iVar2 = (int)((double)iVar4 * 1.5);
        }
        ref_oct->max = iVar2 + iVar4;
        fflush(_stdout);
        pRVar3 = ref_oct->children;
        if (0 < ref_oct->max) {
          pRVar3 = (REF_INT *)realloc(pRVar3,(ulong)(uint)(ref_oct->max << 3) << 2);
          ref_oct->children = pRVar3;
        }
        if (pRVar3 == (REF_INT *)0x0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_oct.c",
                 0xb1,"ref_oct_split","realloc ref_oct->children NULL");
          uVar7 = (long)ref_oct->max * 8;
          lVar5 = (long)ref_oct->max << 5;
        }
        else {
          fflush(_stdout);
          if (ref_oct->max < 1) {
            pRVar3 = ref_oct->nodes;
          }
          else {
            pRVar3 = (REF_INT *)realloc(ref_oct->nodes,(ulong)(uint)ref_oct->max * 0x6c);
            ref_oct->nodes = pRVar3;
          }
          if (pRVar3 != (REF_INT *)0x0) {
            iVar2 = ref_oct->max;
            if (iVar4 < iVar2) {
              pRVar1 = ref_oct->children;
              lVar5 = (long)(iVar4 * 8);
              do {
                pRVar1[lVar5] = -1;
                lVar5 = lVar5 + 1;
                iVar2 = ref_oct->max;
              } while (SBORROW8(lVar5,(long)iVar2 * 8) != lVar5 + (long)iVar2 * -8 < 0);
            }
            lVar5 = (long)iVar4 * 0x1b;
            if ((int)lVar5 < iVar2 * 0x1b) {
              do {
                pRVar3[lVar5] = -1;
                lVar5 = lVar5 + 1;
              } while (lVar5 < (long)ref_oct->max * 0x1b);
            }
            goto LAB_00175df1;
          }
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_oct.c",
                 0xb2,"ref_oct_split","realloc ref_oct->nodes NULL");
          uVar7 = (long)ref_oct->max * 0x1b;
          lVar5 = (long)ref_oct->max * 0x6c;
        }
        printf("failed to realloc n int %d uLong %lu size_of %lu = %lu\n",uVar7 & 0xffffffff,uVar7,4
               ,lVar5);
        return 2;
      }
      pcVar8 = "chunk limit at max";
      uVar6 = 0xae;
    }
    else {
      pcVar8 = "node larger than max";
      uVar6 = 0xa4;
    }
  }
  else {
    pcVar8 = "node larger than n";
    uVar6 = 0xa3;
  }
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_oct.c",uVar6,
         "ref_oct_split",pcVar8);
  return 1;
}

Assistant:

REF_FCN REF_STATUS ref_oct_split(REF_OCT ref_oct, REF_INT node) {
  REF_INT i;
  RAS(node >= 0, "node negative");
  RAS(node < ref_oct_n(ref_oct), "node larger than n");
  RAS(node < ref_oct_max(ref_oct), "node larger than max");
  for (i = 0; i < 8; i++) {
    REIS(REF_EMPTY, ref_oct_child(ref_oct, i, node), "child not empty");
  }
  if (ref_oct_n(ref_oct) + 8 > ref_oct_max(ref_oct)) {
    REF_INT orig, chunk;
    REF_INT max_limit = REF_INT_MAX / 27;
    orig = ref_oct_max(ref_oct);
    /* geometric growth for efficiency */
    chunk = (REF_INT)(1.5 * (REF_DBL)orig);
    RAS(max_limit - orig > 0, "chunk limit at max");
    chunk = MIN(chunk, max_limit - orig);
    ref_oct_max(ref_oct) = orig + chunk;
    ref_realloc(ref_oct->children, 8 * ref_oct->max, REF_INT);
    ref_realloc(ref_oct->nodes, 27 * ref_oct->max, REF_INT);
    for (i = 8 * orig; i < 8 * ref_oct_max(ref_oct); i++)
      ref_oct->children[i] = REF_EMPTY;
    for (i = 27 * orig; i < 27 * ref_oct_max(ref_oct); i++)
      ref_oct->nodes[i] = REF_EMPTY;
  }
  for (i = 0; i < 8; i++) {
    ref_oct_child(ref_oct, i, node) = ref_oct_n(ref_oct);
    (ref_oct_n(ref_oct))++;
  }
  return REF_SUCCESS;
}